

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::append_node(xml_node_struct *child,xml_node_struct *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct **ppxVar3;
  
  child->parent = node;
  pxVar1 = node->first_child;
  if (pxVar1 == (xml_node_struct *)0x0) {
    node->first_child = child;
    ppxVar3 = &child->prev_sibling_c;
  }
  else {
    pxVar2 = pxVar1->prev_sibling_c;
    ppxVar3 = &pxVar1->prev_sibling_c;
    pxVar2->next_sibling = child;
    child->prev_sibling_c = pxVar2;
  }
  *ppxVar3 = child;
  return;
}

Assistant:

inline void append_node(xml_node_struct* child, xml_node_struct* node)
	{
		child->parent = node;

		xml_node_struct* head = node->first_child;

		if (head)
		{
			xml_node_struct* tail = head->prev_sibling_c;

			tail->next_sibling = child;
			child->prev_sibling_c = tail;
			head->prev_sibling_c = child;
		}
		else
		{
			node->first_child = child;
			child->prev_sibling_c = child;
		}
	}